

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlParseSGMLCatalog(xmlCatalogPtr catal,xmlChar *value,char *file,int super)

{
  byte *pbVar1;
  byte bVar2;
  xmlCatalogPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlChar *base;
  ulong uVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlCatalogEntryPtr pxVar9;
  xmlChar *pxVar10;
  byte *pbVar11;
  xmlCatalogEntryType type;
  xmlChar *name;
  xmlChar *sysid;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlCatalogPtr local_38;
  
  if (file == (char *)0x0) {
    iVar4 = -1;
  }
  else {
    base = xmlStrdup((xmlChar *)file);
    pxVar3 = catal;
    if (value != (xmlChar *)0x0) {
LAB_00163376:
      do {
        local_38 = pxVar3;
        bVar2 = *value;
        iVar4 = 0;
        if (bVar2 == 0) goto LAB_001638cc;
        pbVar11 = value + 2;
        value = value + 4;
        while (uVar6 = (ulong)bVar2, bVar2 < 0x2e) {
          if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
            if (uVar6 == 0) goto LAB_001638cc;
            if ((uVar6 == 0x2d) && (pbVar11[-1] == 0x2d)) goto LAB_0016357b;
            break;
          }
          pbVar1 = pbVar11 + -1;
          pbVar11 = pbVar11 + 1;
          value = value + 1;
          bVar2 = *pbVar1;
        }
        local_40 = (xmlChar *)0x0;
        local_48 = (xmlChar *)0x0;
        value = xmlParseSGMLCatalogName(pbVar11 + -2,&local_48);
        pxVar8 = local_48;
        if ((value == (byte *)0x0) || (local_48 == (xmlChar *)0x0)) {
LAB_001638ef:
          iVar4 = -(uint)(value == (byte *)0x0);
          goto LAB_001638cc;
        }
        uVar6 = (ulong)*value;
        if ((0x20 < uVar6) || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0)) {
          (*xmlFree)(local_48);
          iVar4 = 0;
          goto LAB_001638cc;
        }
        while (((byte)uVar6 < 0x21 && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
          pbVar11 = value + 1;
          value = value + 1;
          uVar6 = (ulong)*pbVar11;
        }
        iVar4 = xmlStrEqual(local_48,"SYSTEM");
        if (iVar4 != 0) {
          type = SGML_CATA_SYSTEM;
LAB_001635bf:
          (*xmlFree)(pxVar8);
          local_48 = (xmlChar *)0x0;
          value = xmlParseSGMLCatalogPubid(value,&local_48);
          pxVar8 = local_48;
          if (value == (byte *)0x0) {
LAB_001638fb:
            if (local_48 != (xmlChar *)0x0) {
              (*xmlFree)(local_48);
            }
            iVar4 = -1;
            if (local_40 != (xmlChar *)0x0) {
              (*xmlFree)(local_40);
            }
            goto LAB_001638cc;
          }
          pxVar10 = local_48;
          if ((iVar4 == 0) &&
             (pxVar7 = xmlCatalogNormalizePublic(local_48), pxVar10 = local_48,
             pxVar7 != (xmlChar *)0x0)) {
            if (pxVar8 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar8);
            }
            pxVar10 = pxVar7;
            if (*pxVar7 == '\0') {
              (*xmlFree)(pxVar7);
              local_48 = (xmlChar *)0x0;
              pxVar10 = local_48;
            }
          }
          local_48 = pxVar10;
          uVar6 = (ulong)*value;
          if ((uVar6 < 0x21) && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
            while (((byte)uVar6 < 0x21 && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
              pbVar11 = value + 1;
              value = value + 1;
              uVar6 = (ulong)*pbVar11;
            }
LAB_00163751:
            value = xmlParseSGMLCatalogPubid(value,&local_40);
            if (value == (byte *)0x0) goto LAB_001638fb;
            if (type != SGML_CATA_BASE) goto LAB_00163793;
            if (base != (xmlChar *)0x0) {
              (*xmlFree)(base);
            }
            base = xmlStrdup(local_40);
          }
          else {
LAB_00163793:
            pxVar8 = local_40;
            if ((uint)(type + ~XML_CATA_DELEGATE_URI) < 2) {
              pxVar8 = xmlBuildURI(local_40,base);
              pxVar10 = local_48;
              if (pxVar8 != (xmlChar *)0x0) {
                pxVar9 = xmlNewCatalogEntry(type,local_48,pxVar8,(xmlChar *)0x0,XML_CATA_PREFER_NONE
                                            ,(xmlCatalogEntryPtr)0x0);
                iVar4 = xmlHashAddEntry(local_38->sgml,pxVar10,pxVar9);
                if (iVar4 < 0) {
                  xmlFreeCatalogEntry(pxVar9,pxVar10);
                }
LAB_00163864:
                (*xmlFree)(pxVar8);
              }
            }
            else if (type == SGML_CATA_CATALOG) {
              if (super == 0) {
                pxVar8 = xmlBuildURI(local_40,base);
                if (pxVar8 != (xmlChar *)0x0) {
                  xmlExpandCatalog(local_38,(char *)pxVar8);
                  goto LAB_00163864;
                }
              }
              else {
                pxVar9 = xmlNewCatalogEntry(SGML_CATA_CATALOG,local_40,(xmlChar *)0x0,(xmlChar *)0x0
                                            ,XML_CATA_PREFER_NONE,(xmlCatalogEntryPtr)0x0);
                iVar4 = xmlHashAddEntry(local_38->sgml,pxVar8,pxVar9);
                if (iVar4 < 0) {
                  xmlFreeCatalogEntry(pxVar9,pxVar8);
                }
              }
            }
          }
          if (local_48 != (xmlChar *)0x0) {
            (*xmlFree)(local_48);
          }
LAB_00163888:
          pxVar3 = local_38;
          if (local_40 != (xmlChar *)0x0) {
            (*xmlFree)(local_40);
            pxVar3 = local_38;
          }
          goto LAB_00163376;
        }
        iVar5 = xmlStrEqual(pxVar8,(xmlChar *)"PUBLIC");
        if (iVar5 != 0) {
          type = SGML_CATA_PUBLIC;
          goto LAB_001635bf;
        }
        iVar5 = xmlStrEqual(pxVar8,(xmlChar *)"DELEGATE");
        if (iVar5 != 0) {
          type = SGML_CATA_DELEGATE;
          goto LAB_001635bf;
        }
        iVar4 = xmlStrEqual(pxVar8,"ENTITY");
        if (iVar4 != 0) {
          (*xmlFree)(pxVar8);
          type = (uint)(*value == 0x25) + SGML_CATA_ENTITY;
LAB_001636c4:
          local_48 = (xmlChar *)0x0;
          value = xmlParseSGMLCatalogName(value,&local_48);
          if (value != (byte *)0x0) {
            uVar6 = (ulong)*value;
            if ((uVar6 < 0x21) && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
              while (((byte)uVar6 < 0x21 && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
                pbVar11 = value + 1;
                value = value + 1;
                uVar6 = (ulong)*pbVar11;
              }
              goto LAB_00163751;
            }
            goto LAB_00163793;
          }
          goto LAB_001638fb;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"DOCTYPE");
        if (iVar4 != 0) {
          type = SGML_CATA_DOCTYPE;
LAB_001636af:
          (*xmlFree)(pxVar8);
          goto LAB_001636c4;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"LINKTYPE");
        if (iVar4 != 0) {
          type = SGML_CATA_LINKTYPE;
          goto LAB_001636af;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"NOTATION");
        if (iVar4 != 0) {
          type = SGML_CATA_NOTATION;
          goto LAB_001636af;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"SGMLDECL");
        if (iVar4 != 0) {
          type = SGML_CATA_SGMLDECL;
LAB_0016373c:
          (*xmlFree)(pxVar8);
          local_48 = (xmlChar *)0x0;
          goto LAB_00163751;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"DOCUMENT");
        if (iVar4 != 0) {
          type = SGML_CATA_DOCUMENT;
          goto LAB_0016373c;
        }
        iVar4 = xmlStrEqual(pxVar8,"CATALOG");
        if (iVar4 != 0) {
          type = SGML_CATA_CATALOG;
          goto LAB_0016373c;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"BASE");
        if (iVar4 != 0) {
          type = SGML_CATA_BASE;
          goto LAB_0016373c;
        }
        iVar4 = xmlStrEqual(pxVar8,(xmlChar *)"OVERRIDE");
        (*xmlFree)(pxVar8);
        if (iVar4 == 0) goto LAB_00163888;
        value = xmlParseSGMLCatalogName(value,&local_48);
        if (local_48 == (xmlChar *)0x0) goto LAB_001638ef;
        (*xmlFree)(local_48);
        pxVar3 = local_38;
      } while (value != (byte *)0x0);
    }
LAB_001638c6:
    iVar4 = -1;
LAB_001638cc:
    if (base != (xmlChar *)0x0) {
      (*xmlFree)(base);
    }
  }
  return iVar4;
LAB_0016357b:
  if (value[-2] == 0x2d) {
    pxVar3 = local_38;
    if (value[-1] == 0x2d) goto LAB_00163376;
  }
  else if (value[-2] == 0) goto LAB_001638c6;
  value = value + 1;
  goto LAB_0016357b;
}

Assistant:

static int
xmlParseSGMLCatalog(xmlCatalogPtr catal, const xmlChar *value,
	            const char *file, int super) {
    const xmlChar *cur = value;
    xmlChar *base = NULL;
    int res;

    if ((cur == NULL) || (file == NULL))
        return(-1);
    base = xmlStrdup((const xmlChar *) file);

    while ((cur != NULL) && (cur[0] != 0)) {
	SKIP_BLANKS;
	if (cur[0] == 0)
	    break;
	if ((cur[0] == '-') && (cur[1] == '-')) {
	    cur = xmlParseSGMLCatalogComment(cur);
	    if (cur == NULL) {
		/* error */
		break;
	    }
	} else {
	    xmlChar *sysid = NULL;
	    xmlChar *name = NULL;
	    xmlCatalogEntryType type = XML_CATA_NONE;

	    cur = xmlParseSGMLCatalogName(cur, &name);
	    if (cur == NULL || name == NULL) {
		/* error */
		break;
	    }
	    if (!IS_BLANK_CH(*cur)) {
		/* error */
		xmlFree(name);
		break;
	    }
	    SKIP_BLANKS;
	    if (xmlStrEqual(name, (const xmlChar *) "SYSTEM"))
                type = SGML_CATA_SYSTEM;
	    else if (xmlStrEqual(name, (const xmlChar *) "PUBLIC"))
                type = SGML_CATA_PUBLIC;
	    else if (xmlStrEqual(name, (const xmlChar *) "DELEGATE"))
                type = SGML_CATA_DELEGATE;
	    else if (xmlStrEqual(name, (const xmlChar *) "ENTITY"))
                type = SGML_CATA_ENTITY;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCTYPE"))
                type = SGML_CATA_DOCTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "LINKTYPE"))
                type = SGML_CATA_LINKTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "NOTATION"))
                type = SGML_CATA_NOTATION;
	    else if (xmlStrEqual(name, (const xmlChar *) "SGMLDECL"))
                type = SGML_CATA_SGMLDECL;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCUMENT"))
                type = SGML_CATA_DOCUMENT;
	    else if (xmlStrEqual(name, (const xmlChar *) "CATALOG"))
                type = SGML_CATA_CATALOG;
	    else if (xmlStrEqual(name, (const xmlChar *) "BASE"))
                type = SGML_CATA_BASE;
	    else if (xmlStrEqual(name, (const xmlChar *) "OVERRIDE")) {
		xmlFree(name);
		cur = xmlParseSGMLCatalogName(cur, &name);
		if (name == NULL) {
		    /* error */
		    break;
		}
		xmlFree(name);
		continue;
	    }
	    xmlFree(name);
	    name = NULL;

	    switch(type) {
		case SGML_CATA_ENTITY:
		    if (*cur == '%')
			type = SGML_CATA_PENTITY;
                    /* Falls through. */
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		    cur = xmlParseSGMLCatalogName(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_PUBLIC:
		case SGML_CATA_SYSTEM:
		case SGML_CATA_DELEGATE:
		    cur = xmlParseSGMLCatalogPubid(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (type != SGML_CATA_SYSTEM) {
		        xmlChar *normid;

		        normid = xmlCatalogNormalizePublic(name);
		        if (normid != NULL) {
		            if (name != NULL)
		                xmlFree(name);
		            if (*normid != 0)
		                name = normid;
		            else {
		                xmlFree(normid);
		                name = NULL;
		            }
		        }
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		default:
		    break;
	    }
	    if (cur == NULL) {
		if (name != NULL)
		    xmlFree(name);
		if (sysid != NULL)
		    xmlFree(sysid);
		break;
	    } else if (type == SGML_CATA_BASE) {
		if (base != NULL)
		    xmlFree(base);
		base = xmlStrdup(sysid);
	    } else if ((type == SGML_CATA_PUBLIC) ||
		       (type == SGML_CATA_SYSTEM)) {
		xmlChar *filename;

		filename = xmlBuildURI(sysid, base);
		if (filename != NULL) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, name, filename,
			                       NULL, XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, name, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		    xmlFree(filename);
		}

	    } else if (type == SGML_CATA_CATALOG) {
		if (super) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, sysid, NULL, NULL,
			                       XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, sysid, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		} else {
		    xmlChar *filename;

		    filename = xmlBuildURI(sysid, base);
		    if (filename != NULL) {
			xmlExpandCatalog(catal, (const char *)filename);
			xmlFree(filename);
		    }
		}
	    }
	    /*
	     * drop anything else we won't handle it
	     */
	    if (name != NULL)
		xmlFree(name);
	    if (sysid != NULL)
		xmlFree(sysid);
	}
    }
    if (base != NULL)
	xmlFree(base);
    if (cur == NULL)
	return(-1);
    return(0);
}